

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_rotate(double *xp,double *yp,DAngle *a)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double tmpx;
  double y;
  double x;
  DAngle *local_20;
  DAngle *a_local;
  double *yp_local;
  double *xp_local;
  
  local_20 = a;
  a_local = (DAngle *)yp;
  yp_local = xp;
  if ((AM_rotate(double*,double*,TAngle<double>)::angle_saved == '\0') &&
     (iVar2 = __cxa_guard_acquire(&AM_rotate(double*,double*,TAngle<double>)::angle_saved),
     iVar2 != 0)) {
    TAngle<double>::TAngle(&AM_rotate::angle_saved,0.0);
    __cxa_guard_release(&AM_rotate(double*,double*,TAngle<double>)::angle_saved);
  }
  TAngle<double>::TAngle((TAngle<double> *)&x,a);
  bVar1 = TAngle<double>::operator!=(&AM_rotate::angle_saved,(TAngle<double> *)&x);
  if (bVar1) {
    TAngle<double>::operator=(&AM_rotate::angle_saved,a);
    dVar3 = TAngle<double>::Radians(a);
    AM_rotate::sinrot = sin(dVar3);
    dVar3 = TAngle<double>::Radians(a);
    AM_rotate::cosrot = cos(dVar3);
  }
  dVar3 = *yp_local * AM_rotate::sinrot;
  dVar4 = a_local->Degrees * AM_rotate::cosrot;
  *yp_local = *yp_local * AM_rotate::cosrot - a_local->Degrees * AM_rotate::sinrot;
  a_local->Degrees = dVar3 + dVar4;
  return;
}

Assistant:

void AM_rotate(double *xp, double *yp, DAngle a)
{
	static DAngle angle_saved = 0.;
	static double sinrot = 0;
	static double cosrot = 1;

	if (angle_saved != a)
	{
		angle_saved = a;
		sinrot = sin(a.Radians());
		cosrot = cos(a.Radians());
	}

	double x = *xp;
	double y = *yp;
	double tmpx = (x * cosrot) - (y * sinrot);
	y = (x * sinrot) + (y * cosrot);
	x = tmpx;
	*xp = x;
	*yp = y;
}